

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O1

void __thiscall antlr::RecognitionException::RecognitionException(RecognitionException *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"parsing error","");
  (this->super_ANTLRException)._vptr_ANTLRException = (_func_int **)&PTR__ANTLRException_00302108;
  (this->super_ANTLRException).text._M_dataplus._M_p =
       (pointer)&(this->super_ANTLRException).text.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_ANTLRException).text,local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  (this->super_ANTLRException)._vptr_ANTLRException =
       (_func_int **)&PTR__RecognitionException_00303080;
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  this->line = -1;
  this->column = -1;
  return;
}

Assistant:

RecognitionException::RecognitionException()
: ANTLRException("parsing error")
, line(-1)
, column(-1)
{
}